

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O0

int MT_basic_insert_test(void)

{
  LatencyCollector *pLVar1;
  reference pvVar2;
  Msg *this;
  Msg msg_stream;
  LatencyDumpDefaultImpl default_dump;
  vector<test_args,_std::allocator<test_args>_> args;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> t_hdl;
  LatencyCollector lat;
  size_t n_threads;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  LatencyCollector *pLVar3;
  function<void_(TestSuite::ThreadArgs_*)> *in_stack_fffffffffffffe40;
  _func_int_ThreadArgs_ptr *in_stack_fffffffffffffe48;
  ThreadHolder *in_stack_fffffffffffffe50;
  size_type in_stack_fffffffffffffe58;
  vector<test_args,_std::allocator<test_args>_> *this_00;
  vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>
  *in_stack_fffffffffffffe60;
  ThreadExitHandler *t_handler;
  ThreadHolder *t_func;
  ThreadArgs *u_args;
  LatencyCollector *in_stack_fffffffffffffe90;
  ThreadHolder *this_01;
  LatencyCollectorDumpOptions *opt;
  LatencyCollectorDumpOptions in_stack_fffffffffffffea8;
  string local_150 [32];
  LatencyCollectorDumpOptions local_130;
  string local_128 [39];
  Msg local_101 [9];
  ThreadExitHandler local_f8 [2];
  ThreadArgs local_b1;
  vector<test_args,_std::allocator<test_args>_> local_b0;
  undefined1 local_91 [25];
  LatencyCollector local_78;
  ThreadHolder *local_20;
  ThreadHolder *local_18;
  
  pLVar1 = (LatencyCollector *)operator_new(0x58);
  LatencyCollector::LatencyCollector(in_stack_fffffffffffffe90);
  global_lat = pLVar1;
  local_20 = (ThreadHolder *)0x8;
  pLVar1 = global_lat;
  LatencyCollector::LatencyCollector(in_stack_fffffffffffffe90);
  opt = (LatencyCollectorDumpOptions *)local_91;
  this_01 = local_20;
  std::allocator<TestSuite::ThreadHolder>::allocator((allocator<TestSuite::ThreadHolder> *)0x1038f7)
  ;
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::vector
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (allocator_type *)in_stack_fffffffffffffe50);
  std::allocator<TestSuite::ThreadHolder>::~allocator
            ((allocator<TestSuite::ThreadHolder> *)0x10391d);
  u_args = &local_b1;
  t_func = local_20;
  std::allocator<test_args>::allocator((allocator<test_args> *)0x10393c);
  std::vector<test_args,_std::allocator<test_args>_>::vector
            ((vector<test_args,_std::allocator<test_args>_> *)in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe58,(allocator_type *)in_stack_fffffffffffffe50);
  std::allocator<test_args>::~allocator((allocator<test_args> *)0x103962);
  for (local_18 = (ThreadHolder *)0x0; local_18 < local_20;
      local_18 = (ThreadHolder *)
                 ((long)&(((_Function_base *)&local_18->tid)->_M_functor)._M_unused + 1)) {
    this_00 = &local_b0;
    pvVar2 = std::vector<test_args,_std::allocator<test_args>_>::operator[]
                       (this_00,(size_type)local_18);
    pvVar2->lat = &local_78;
    std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::operator[]
              ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)
               (local_91 + 1),(size_type)local_18);
    std::vector<test_args,_std::allocator<test_args>_>::operator[](this_00,(size_type)local_18);
    std::function<int(TestSuite::ThreadArgs*)>::function<int(&)(TestSuite::ThreadArgs*),void>
              ((function<int_(TestSuite::ThreadArgs_*)> *)in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48);
    t_handler = local_f8;
    std::function<void_(TestSuite::ThreadArgs_*)>::function
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    TestSuite::ThreadHolder::spawn(this_01,u_args,(ThreadFunc *)t_func,t_handler);
    std::function<void_(TestSuite::ThreadArgs_*)>::~function
              ((function<void_(TestSuite::ThreadArgs_*)> *)0x103a31);
    std::function<int_(TestSuite::ThreadArgs_*)>::~function
              ((function<int_(TestSuite::ThreadArgs_*)> *)0x103a3e);
  }
  for (local_18 = (ThreadHolder *)0x0; local_18 < local_20;
      local_18 = (ThreadHolder *)((long)&((_Function_base *)&local_18->tid)->_M_functor + 1)) {
    std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::operator[]
              ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)
               (local_91 + 1),(size_type)local_18);
    TestSuite::ThreadHolder::join
              (in_stack_fffffffffffffe50,SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0));
  }
  LatencyDumpDefaultImpl::LatencyDumpDefaultImpl
            ((LatencyDumpDefaultImpl *)in_stack_fffffffffffffe40);
  TestSuite::Msg::Msg(local_101);
  LatencyCollectorDumpOptions::LatencyCollectorDumpOptions(&local_130);
  LatencyCollector::dump_abi_cxx11_
            ((LatencyCollector *)in_stack_fffffffffffffea8,(LatencyDump *)pLVar1,opt);
  this = TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffe40,(EndlFunc)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_128);
  LatencyCollectorDumpOptions::LatencyCollectorDumpOptions
            ((LatencyCollectorDumpOptions *)&stack0xfffffffffffffea8);
  LatencyCollector::dump_abi_cxx11_
            ((LatencyCollector *)in_stack_fffffffffffffea8,(LatencyDump *)pLVar1,opt);
  pLVar1 = (LatencyCollector *)
           TestSuite::Msg::operator<<((Msg *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  TestSuite::Msg::operator<<((Msg *)pLVar1,(EndlFunc)in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_150);
  if (global_lat != (LatencyCollector *)0x0) {
    pLVar3 = global_lat;
    LatencyCollector::~LatencyCollector(pLVar1);
    operator_delete(pLVar3);
  }
  global_lat = (LatencyCollector *)0x0;
  std::vector<test_args,_std::allocator<test_args>_>::~vector
            ((vector<test_args,_std::allocator<test_args>_> *)this);
  std::vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_>::~vector
            ((vector<TestSuite::ThreadHolder,_std::allocator<TestSuite::ThreadHolder>_> *)this);
  LatencyCollector::~LatencyCollector(pLVar1);
  return 0;
}

Assistant:

int MT_basic_insert_test() {
    global_lat = new LatencyCollector();

    size_t i;
    size_t n_threads = 8;

    LatencyCollector lat;

    std::vector<TestSuite::ThreadHolder> t_hdl(n_threads);
    std::vector<test_args> args(n_threads);
    for (i=0; i<n_threads; ++i) {
        args[i].lat = &lat;
        t_hdl[i].spawn(&args[i], insert_thread, nullptr);
    }

    for (i=0; i<n_threads; ++i){
        t_hdl[i].join();
    }

    LatencyDumpDefaultImpl default_dump;
    TestSuite::Msg msg_stream;
    msg_stream << lat.dump(&default_dump) << std::endl;
    msg_stream << global_lat->dump(&default_dump) << std::endl;

    delete global_lat;
    global_lat = nullptr;

    return 0;
}